

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.cpp
# Opt level: O2

Error * ot::commissioner::CommissionerImpl::EncodeBbrDataset
                  (Error *__return_storage_ptr__,Request *aRequest,BbrDataset *aDataset)

{
  ushort uVar1;
  ErrorCode EVar2;
  Error *pEVar3;
  Tlv local_80;
  undefined1 local_60 [40];
  Address addr;
  
  __return_storage_ptr__->mCode = kNone;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  uVar1 = aDataset->mPresentFlags;
  if ((short)uVar1 < 0) {
    tlv::Tlv::Tlv(&local_80,kTriHostname,&aDataset->mTriHostname,kMeshCoP);
    AppendTlv((Error *)local_60,aRequest,&local_80);
    pEVar3 = Error::operator=(__return_storage_ptr__,(Error *)local_60);
    EVar2 = pEVar3->mCode;
    std::__cxx11::string::~string((string *)(local_60 + 8));
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&local_80.mValue.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    if (EVar2 != kNone) {
      return __return_storage_ptr__;
    }
    uVar1 = aDataset->mPresentFlags;
  }
  if ((uVar1 >> 0xe & 1) != 0) {
    tlv::Tlv::Tlv(&local_80,kRegistrarHostname,&aDataset->mRegistrarHostname,kMeshCoP);
    AppendTlv((Error *)local_60,aRequest,&local_80);
    pEVar3 = Error::operator=(__return_storage_ptr__,(Error *)local_60);
    EVar2 = pEVar3->mCode;
    std::__cxx11::string::~string((string *)(local_60 + 8));
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&local_80.mValue.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    if (EVar2 != kNone) {
      return __return_storage_ptr__;
    }
    uVar1 = aDataset->mPresentFlags;
  }
  if ((uVar1 >> 0xd & 1) != 0) {
    addr.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    addr.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    addr.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    Address::Set((Error *)local_60,&addr,&aDataset->mRegistrarIpv6Addr);
    pEVar3 = Error::operator=(__return_storage_ptr__,(Error *)local_60);
    EVar2 = pEVar3->mCode;
    std::__cxx11::string::~string((string *)(local_60 + 8));
    if (EVar2 == kNone) {
      tlv::Tlv::Tlv(&local_80,kRegistrarIpv6Address,&addr.mBytes,kMeshCoP);
      AppendTlv((Error *)local_60,aRequest,&local_80);
      Error::operator=(__return_storage_ptr__,(Error *)local_60);
      std::__cxx11::string::~string((string *)(local_60 + 8));
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&local_80.mValue.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
      ;
    }
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&addr);
  }
  return __return_storage_ptr__;
}

Assistant:

Error CommissionerImpl::EncodeBbrDataset(coap::Request &aRequest, const BbrDataset &aDataset)
{
    Error error;

    if (aDataset.mPresentFlags & BbrDataset::kTriHostnameBit)
    {
        SuccessOrExit(error = AppendTlv(aRequest, {tlv::Type::kTriHostname, aDataset.mTriHostname}));
    }

    if (aDataset.mPresentFlags & BbrDataset::kRegistrarHostnameBit)
    {
        SuccessOrExit(error = AppendTlv(aRequest, {tlv::Type::kRegistrarHostname, aDataset.mRegistrarHostname}));
    }

    if (aDataset.mPresentFlags & BbrDataset::kRegistrarIpv6AddrBit)
    {
        Address addr;

        SuccessOrExit(error = addr.Set(aDataset.mRegistrarIpv6Addr));
        SuccessOrExit(error = AppendTlv(aRequest, {tlv::Type::kRegistrarIpv6Address, addr.GetRaw()}));
    }

exit:
    return error;
}